

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsBody.cpp
# Opt level: O1

void __thiscall
chrono::ChShaftsBodyTranslation::ConstraintsLoadJacobians(ChShaftsBodyTranslation *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ChBodyFrame *pCVar16;
  ChConstraintTwoGeneric *this_00;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  ChRowVectorRef local_30;
  
  pCVar16 = this->body;
  dVar1 = (this->shaft_dir).m_data[0];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar1;
  dVar2 = (this->shaft_dir).m_data[1];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       dVar2 * *(double *)
                ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data + 8);
  auVar7 = vfmadd231sd_fma(auVar26,auVar21,auVar7);
  dVar3 = (this->shaft_dir).m_data[2];
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar3;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(double *)
                  ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x10);
  auVar7 = vfmadd231sd_fma(auVar7,auVar25,auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(double *)
                  ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x18);
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       dVar2 * *(double *)
                ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data + 0x20);
  auVar8 = vfmadd231sd_fma(auVar27,auVar21,auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       *(double *)
        ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  auVar8 = vfmadd231sd_fma(auVar8,auVar25,auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       *(double *)
        ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       dVar2 * *(double *)
                ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data + 0x38);
  auVar9 = vfmadd231sd_fma(auVar17,auVar21,auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       *(double *)
        ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar9 = vfmadd231sd_fma(auVar9,auVar25,auVar12);
  dVar4 = (this->shaft_pos).m_data[1];
  dVar5 = (this->shaft_pos).m_data[2];
  dVar6 = (this->shaft_pos).m_data[0];
  this_00 = &this->constraint;
  ChConstraintTwoGeneric::Get_Cq_a(&local_30,this_00);
  if (0 < local_30.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
          .m_cols.m_value) {
    *local_30.
     super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>.
     super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
     .
     super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
     .m_data = -1.0;
    ChConstraintTwoGeneric::Get_Cq_b(&local_30,this_00);
    if (0 < local_30.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
            .m_cols.m_value) {
      *local_30.
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
       .
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
       .
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
       .m_data = auVar7._0_8_;
      ChConstraintTwoGeneric::Get_Cq_b(&local_30,this_00);
      if (1 < local_30.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
              .m_cols.m_value) {
        local_30.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
        .m_data[1] = auVar8._0_8_;
        ChConstraintTwoGeneric::Get_Cq_b(&local_30,this_00);
        if (2 < local_30.
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
                .m_cols.m_value) {
          local_30.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
          .m_data[2] = auVar9._0_8_;
          ChConstraintTwoGeneric::Get_Cq_b(&local_30,this_00);
          if (3 < local_30.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
                  .m_cols.m_value) {
            auVar22._8_8_ = 0;
            auVar22._0_8_ = dVar3;
            auVar13._8_8_ = 0;
            auVar13._0_8_ = dVar4;
            auVar18._8_8_ = 0;
            auVar18._0_8_ = dVar5 * dVar2;
            auVar7 = vfmsub231sd_fma(auVar18,auVar22,auVar13);
            local_30.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
            .m_data[3] = auVar7._0_8_;
            ChConstraintTwoGeneric::Get_Cq_b(&local_30,this_00);
            if (4 < local_30.
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                    .
                    super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                    .
                    super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
                    .m_cols.m_value) {
              auVar23._8_8_ = 0;
              auVar23._0_8_ = dVar5;
              auVar14._8_8_ = 0;
              auVar14._0_8_ = dVar1;
              auVar19._8_8_ = 0;
              auVar19._0_8_ = dVar3 * dVar6;
              auVar7 = vfmsub132sd_fma(auVar23,auVar19,auVar14);
              local_30.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
              .m_data[4] = auVar7._0_8_;
              ChConstraintTwoGeneric::Get_Cq_b(&local_30,this_00);
              if (5 < local_30.
                      super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                      .
                      super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                      .
                      super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
                      .m_cols.m_value) {
                auVar24._8_8_ = 0;
                auVar24._0_8_ = dVar2;
                auVar15._8_8_ = 0;
                auVar15._0_8_ = dVar6;
                auVar20._8_8_ = 0;
                auVar20._0_8_ = dVar1 * dVar4;
                auVar7 = vfmsub132sd_fma(auVar24,auVar20,auVar15);
                local_30.
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_0>
                .m_data[5] = auVar7._0_8_;
                return;
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, 1, -1>>, 1>::operator()(Index) [Derived = Eigen::Ref<Eigen::Matrix<double, 1, -1>>, Level = 1]"
               );
}

Assistant:

void ChShaftsBodyTranslation::ConstraintsLoadJacobians() {
    // compute jacobians
    ChVector<> jacx = body->TransformDirectionLocalToParent(shaft_dir);
    ChVector<> jacw = Vcross(shaft_pos, shaft_dir);

    constraint.Get_Cq_a()(0) = -1.0;

    constraint.Get_Cq_b()(0) = jacx.x();
    constraint.Get_Cq_b()(1) = jacx.y();
    constraint.Get_Cq_b()(2) = jacx.z();
    constraint.Get_Cq_b()(3) = jacw.x();
    constraint.Get_Cq_b()(4) = jacw.y();
    constraint.Get_Cq_b()(5) = jacw.z();
}